

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O0

void __thiscall pg::MSPMSolver::solve(MSPMSolver *this,int node,int str)

{
  bool bVar1;
  uint winner;
  int iVar2;
  uint uVar3;
  int iVar4;
  Error *this_00;
  ostream *poVar5;
  void *pvVar6;
  reference pvVar7;
  long lVar8;
  int local_120;
  int local_e0;
  int local_b0;
  int i;
  int to;
  int *curedge_1;
  bool escapes;
  int *piStack_98;
  int from;
  int *curedge;
  undefined1 local_88 [4];
  int n;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int pl;
  int *pm;
  int str_local;
  int node_local;
  MSPMSolver *this_local;
  
  winner = (uint)(this->pms[this->k * node] != -1);
  pm._0_4_ = str;
  pm._4_4_ = node;
  _str_local = this;
  if ((this->pms + this->k * node)[(int)winner] != -1) {
    this_00 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_00,"logic error",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                 ,0xef);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  if ((this->super_Solver).trace != 0) {
    poVar5 = std::operator<<((this->super_Solver).logger,"Detected \x1b[1;31mTop\x1b[m from ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pm._4_4_);
    poVar5 = std::operator<<(poVar5,"/");
    iVar2 = Solver::priority(&this->super_Solver,pm._4_4_);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)pm);
    poVar5 = std::operator<<(poVar5,"/");
    iVar2 = Solver::priority(&this->super_Solver,(int)pm);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar2);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_88);
  iVar2 = pm._4_4_;
  uVar3 = Solver::owner(&this->super_Solver,pm._4_4_);
  if (uVar3 == winner) {
    local_e0 = (int)pm;
  }
  else {
    local_e0 = -1;
  }
  Solver::solve(&this->super_Solver,iVar2,winner,local_e0);
  this->cover[pm._4_4_] = -1;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_88,
             (value_type *)((long)&pm + 4));
  todo_push(this,pm._4_4_);
  do {
    bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_88);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      iVar2 = this->coverdepth + 1;
      this->coverdepth = iVar2;
      coverlower(this,pm._4_4_,iVar2);
      if (0 < (this->super_Solver).trace) {
        poVar5 = std::operator<<((this->super_Solver).logger,"Cover status:");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        for (local_b0 = 0; lVar8 = Solver::nodecount(&this->super_Solver), local_b0 < lVar8;
            local_b0 = local_b0 + 1) {
          if (this->cover[local_b0] != 0) {
            poVar5 = (ostream *)std::ostream::operator<<((this->super_Solver).logger,local_b0);
            poVar5 = std::operator<<(poVar5,"/");
            iVar2 = Solver::priority(&this->super_Solver,local_b0);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
            poVar5 = std::operator<<(poVar5,": ");
            pvVar6 = (void *)std::ostream::operator<<(poVar5,this->cover[local_b0]);
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_88);
      return;
    }
    pvVar7 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_88);
    curedge._4_4_ = *pvVar7;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_88);
    for (piStack_98 = Solver::ins(&this->super_Solver,curedge._4_4_); *piStack_98 != -1;
        piStack_98 = piStack_98 + 1) {
      curedge_1._4_4_ = *piStack_98;
      if (this->cover[curedge_1._4_4_] == 0) {
        iVar2 = Solver::priority(&this->super_Solver,curedge_1._4_4_);
        iVar4 = Solver::priority(&this->super_Solver,pm._4_4_);
        if (iVar2 <= iVar4) {
          uVar3 = Solver::owner(&this->super_Solver,curedge_1._4_4_);
          if (uVar3 != winner) {
            curedge_1._3_1_ = 0;
            for (_i = Solver::outs(&this->super_Solver,curedge_1._4_4_); *_i != -1; _i = _i + 1) {
              if (-1 < this->cover[*_i]) {
                curedge_1._3_1_ = 1;
                break;
              }
            }
            if ((curedge_1._3_1_ & 1) != 0) goto LAB_002158fe;
          }
          iVar2 = curedge_1._4_4_;
          uVar3 = Solver::owner(&this->super_Solver,curedge_1._4_4_);
          if (uVar3 == winner) {
            local_120 = curedge._4_4_;
          }
          else {
            local_120 = -1;
          }
          Solver::solve(&this->super_Solver,iVar2,winner,local_120);
          this->cover[curedge_1._4_4_] = -1;
          this->pms[(int)(this->k * curedge_1._4_4_ + winner)] = -1;
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_88,
                     (value_type *)((long)&curedge_1 + 4));
          todo_push(this,curedge_1._4_4_);
        }
      }
LAB_002158fe:
    }
  } while( true );
}

Assistant:

void
MSPMSolver::solve(int node, int str)
{
    int *pm = pms + k*node;
    const int pl = pm[0] == -1 ? 0 : 1;
    if (pm[pl] != -1) LOGIC_ERROR;

    if (trace) logger << "Detected \033[1;31mTop\033[m from " << node << "/" << priority(node) << " to " << str << "/" << priority(str) << std::endl;

    // initialize
    std::queue<int> q;

    // solve <node>
    Solver::solve(node, pl, owner(node) == pl ? str : -1);
    // if (pl == (priority(node)&1)) counts[priority(node)]--;
    cover[node] = -1;
    q.push(node);
    todo_push(node);

    // attract within uncovered area to <node> for <pl>
    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            // logger << "trying edge " << from << "/" << priority(from) << " to " << n << std::endl;
            if (cover[from]) continue;
            if (priority(from) > priority(node)) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] < 0) continue; // disabled or already solved
                    // if (cover[to] != 0) LOGIC_ERROR; // should have been covered
                    // ^--- it can escape, happens when alternating!
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            Solver::solve(from, pl, owner(from) == pl ? n : -1);
            // if (winner == (priority(from)&1)) counts[priority(from)]--;
            cover[from] = -1;
            pms[k*from+pl] = -1;
            q.push(from);
            todo_push(from);
        }
    }

    // after lifting, cover everything that is lower
    coverlower(node, ++coverdepth);

    if (trace >= 1) {
        logger << "Cover status:" << std::endl;
        for (int i=0; i<nodecount(); i++) {
            if (cover[i]) logger << i << "/" << priority(i) << ": " << cover[i] << std::endl;
        }
    }
}